

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void forbody(LexState *ls,int base,int line,int nvars,int isnum,Fornuminfo *info)

{
  LexState *ls_00;
  int iVar1;
  int list;
  OpCode o;
  BlockCnt bl;
  OpCode local_50;
  BlockCnt local_48;
  
  ls_00 = (LexState *)ls->fs;
  adjustlocalvars(ls_00,3);
  checknext(ls,0x103);
  if (isnum == 0) {
    iVar1 = luaK_jump((FuncState *)ls_00);
    local_50 = OP_FORLOOP;
  }
  else {
    local_50 = OP_FORLOOP;
    (ls->fs->f->ravi_jit).jit_flags = '\x01';
    o = OP_FORPREP;
    if ((info != (Fornuminfo *)0x0) && (info->is_constant != 0)) {
      iVar1 = info->int_value;
      if (iVar1 < 2) {
        local_50 = OP_FORLOOP;
        if (iVar1 == 1) {
          local_50 = OP_RAVI_FORLOOP_I1;
        }
        o = OP_FORPREP;
        if (iVar1 == 1) {
          o = OP_RAVI_FORPREP_I1;
        }
      }
      else {
        local_50 = OP_RAVI_FORLOOP_IP;
        o = OP_RAVI_FORPREP_IP;
      }
    }
    iVar1 = luaK_codeABx((FuncState *)ls_00,o,base,0x7fff);
  }
  enterblock((FuncState *)ls_00,&local_48,'\0');
  adjustlocalvars((LexState *)ls->fs,nvars);
  luaK_reserveregs((FuncState *)ls_00,nvars);
  block(ls);
  leaveblock((FuncState *)ls_00);
  luaK_patchtohere((FuncState *)ls_00,iVar1);
  if (isnum == 0) {
    luaK_codeABC((FuncState *)ls_00,OP_TFORCALL,base,0,nvars);
    luaK_fixline((FuncState *)ls_00,line);
    list = luaK_codeABx((FuncState *)ls_00,OP_TFORLOOP,base + 2,0x7fff);
  }
  else {
    list = luaK_codeABx((FuncState *)ls_00,local_50,base,0x7fff);
  }
  luaK_patchlist((FuncState *)ls_00,list,iVar1 + 1);
  luaK_fixline((FuncState *)ls_00,line);
  return;
}

Assistant:

static void forbody (LexState *ls, int base, int line, int nvars, int isnum, Fornuminfo *info) {
  /* forbody -> DO block */
  BlockCnt bl;
  OpCode forprep_inst = OP_FORPREP, forloop_inst = OP_FORLOOP;
  FuncState *fs = ls->fs;
  int prep, endfor;
  adjustlocalvars(ls, 3);  /* control variables */
  checknext(ls, TK_DO);
  if (isnum) {
    ls->fs->f->ravi_jit.jit_flags = RAVI_JIT_FLAG_HASFORLOOP;
    if (info && info->is_constant && info->int_value > 1) {
      forprep_inst = OP_RAVI_FORPREP_IP;
      forloop_inst = OP_RAVI_FORLOOP_IP;
    }
    else if (info && info->is_constant && info->int_value == 1) {
      forprep_inst = OP_RAVI_FORPREP_I1;
      forloop_inst = OP_RAVI_FORLOOP_I1;
    }
  }
  prep = isnum ? luaK_codeAsBx(fs, forprep_inst, base, NO_JUMP) : luaK_jump(fs);
  enterblock(fs, &bl, 0);  /* scope for declared variables */
  adjustlocalvars(ls, nvars);
  luaK_reserveregs(fs, nvars);
  block(ls);
  leaveblock(fs);  /* end of scope for declared variables */
  luaK_patchtohere(fs, prep);
  if (isnum)  /* numeric for? */
    endfor = luaK_codeAsBx(fs, forloop_inst, base, NO_JUMP);
  else {  /* generic for */
    luaK_codeABC(fs, OP_TFORCALL, base, 0, nvars);
    luaK_fixline(fs, line);
    endfor = luaK_codeAsBx(fs, OP_TFORLOOP, base + 2, NO_JUMP);
  }
  luaK_patchlist(fs, endfor, prep + 1);
  luaK_fixline(fs, line);
}